

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.hpp
# Opt level: O3

void __thiscall OpenMD::Bend::~Bend(Bend *this)

{
  ~Bend(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

virtual ~Bend() {}